

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O3

void __thiscall density::lifo_array<MyStruct>::~lifo_array(lifo_array<MyStruct> *this)

{
  MyStruct *i_block;
  LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *this_00;
  MyStruct *pMVar1;
  size_t sVar2;
  long *in_FS_OFFSET;
  
  i_block = (this->super_LifoArrayImpl<MyStruct,_false>).m_elements;
  sVar2 = (this->super_LifoArrayImpl<MyStruct,_false>).m_size;
  if (i_block <= i_block + (sVar2 - 1)) {
    this_00 = &i_block[sVar2 - 1].m_other_strings.
               super_LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ;
    do {
      lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      destroy_elements((lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_00);
      detail::
      LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ::~LifoArrayImpl(this_00);
      lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      destroy_elements((lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(this_00 + -1));
      detail::
      LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ::~LifoArrayImpl(this_00 + -1);
      i_block = (this->super_LifoArrayImpl<MyStruct,_false>).m_elements;
      pMVar1 = (MyStruct *)(this_00 + -3);
      this_00 = this_00 + -2;
    } while (i_block <= pMVar1);
    sVar2 = (this->super_LifoArrayImpl<MyStruct,_false>).m_size;
  }
  detail::ThreadLifoAllocator<0>::s_allocator::__tls_init();
  if ((in_FS_OFFSET[-0x19] ^ (ulong)i_block) < 0x10000) {
    in_FS_OFFSET[-0x19] = (long)i_block;
    return;
  }
  lifo_allocator<density::basic_default_allocator<65536UL>,_8UL>::deallocate_slow_path
            ((lifo_allocator<density::basic_default_allocator<65536UL>,_8UL> *)
             (*in_FS_OFFSET + -200),i_block,sVar2 << 5);
  return;
}

Assistant:

void destroy_elements(std::false_type) noexcept
        {
            auto it = m_elements + m_size;
            it--;
            for (; it >= m_elements; it--)
            {
                it->TYPE::~TYPE();
            }
        }